

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O3

void __thiscall simulator_error::~simulator_error(simulator_error *this)

{
  ~simulator_error(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~simulator_error() throw() { }